

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_4UL>::push_back
          (CircularArray<(anonymous_namespace)::TestObject,_4UL> *this,value_type *value)

{
  size_type index;
  reference element;
  value_type *value_local;
  CircularArray<(anonymous_namespace)::TestObject,_4UL> *this_local;
  
  if (this->size_ < 4) {
    index = this->size_;
    this->size_ = index + 1;
    element = at(this,index);
    CircularArray<(anonymous_namespace)::TestObject,4ul>::
    SetElement<(anonymous_namespace)::TestObject_const&>
              ((CircularArray<(anonymous_namespace)::TestObject,4ul> *)this,element,value);
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<(anonymous namespace)::TestObject, 4>::push_back(const value_type &) [T = (anonymous namespace)::TestObject, kCapacity = 4]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }